

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O3

bool __thiscall
crnlib::dxt1_endpoint_optimizer::refine_solution(dxt1_endpoint_optimizer *this,int refinement_level)

{
  anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0 aVar1;
  unique_color *puVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  uchar uVar7;
  bool bVar8;
  uint16 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  undefined8 uVar14;
  uint uVar15;
  uint uVar16;
  int br;
  bool bVar17;
  ulong uVar18;
  ulong uVar19;
  int gr;
  unsigned_short __tmp;
  uchar uVar20;
  int iVar21;
  int rr;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar33;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar39;
  undefined1 auVar38 [16];
  double dVar40;
  uint uVar41;
  uint uVar42;
  double dVar43;
  color_quad_u8 c [2];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_88;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_84;
  dxt1_solution_coordinates local_80;
  uint local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  dxt1_endpoint_optimizer *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  paVar22 = &local_88;
  if (this->m_evaluate_hc == true) {
    compute_selectors_hc(this);
  }
  uVar13 = (ulong)(this->m_unique_colors).m_size;
  if (uVar13 == 0) {
    dVar30 = 0.0;
    dVar33 = 0.0;
    dVar23 = 0.0;
    dVar35 = 0.0;
    dVar34 = 0.0;
    dVar27 = 0.0;
    dVar26 = 0.0;
    dVar28 = 0.0;
    dVar29 = 0.0;
  }
  else {
    puVar2 = (this->m_unique_colors).m_p;
    dVar23 = 0.0;
    uVar18 = 0;
    dVar30 = 0.0;
    dVar33 = 0.0;
    dVar28 = 0.0;
    dVar29 = 0.0;
    dVar26 = 0.0;
    dVar27 = 0.0;
    dVar34 = 0.0;
    dVar35 = 0.0;
    do {
      dVar36 = (double)puVar2[uVar18].m_weight;
      aVar1 = puVar2[uVar18].m_color.field_0.field_0;
      uVar19 = (ulong)aVar1._0_2_ & 0xffffffffffff00ff;
      auVar3._8_4_ = 0;
      auVar3._0_8_ = uVar19;
      auVar3[0xc] = aVar1.a;
      auVar4[8] = aVar1.b;
      auVar4._0_8_ = uVar19;
      auVar4[9] = 0;
      auVar4._10_3_ = auVar3._10_3_;
      auVar6._5_8_ = 0;
      auVar6._0_5_ = auVar4._8_5_;
      auVar5[4] = aVar1.g;
      auVar5._0_4_ = (int)uVar19;
      auVar5[5] = 0;
      auVar5._6_7_ = SUB137(auVar6 << 0x40,6);
      dVar37 = (double)(int)uVar19 * dVar36;
      dVar39 = (double)auVar5._4_4_ * dVar36;
      uVar19 = (ulong)(((this->m_best_solution).m_selectors.m_p[uVar18] ^ 1) << 2);
      dVar40 = (double)puVar2[uVar18].m_color.field_0.field_0.b * dVar36;
      dVar30 = dVar30 + (double)*(int *)((long)refine_solution::prods_1 + uVar19) * dVar36;
      dVar33 = dVar33 + (double)*(int *)((long)refine_solution::prods_2 + uVar19) * dVar36;
      dVar43 = (double)*(int *)((long)refine_solution::w1Tab + uVar19);
      dVar28 = dVar28 + dVar37;
      dVar29 = dVar29 + dVar39;
      dVar34 = dVar34 + dVar39 * dVar43;
      dVar35 = dVar35 + dVar40 * dVar43;
      dVar26 = dVar26 + dVar36 * (double)*(int *)((long)refine_solution::prods_0 + uVar19);
      dVar27 = dVar27 + dVar37 * dVar43;
      dVar23 = dVar23 + dVar40;
      uVar18 = uVar18 + 1;
    } while (uVar13 != uVar18);
  }
  if ((((dVar30 != 0.0) || (bVar17 = false, NAN(dVar30))) &&
      ((bVar17 = false, dVar33 != 0.0 || (NAN(dVar33))))) &&
     (dVar36 = dVar33 * dVar30 - dVar26 * dVar26, 1.249999968422344e-05 <= ABS(dVar36))) {
    dVar43 = -dVar27;
    dVar40 = dVar28 * 3.0 - dVar27;
    dVar39 = -dVar34;
    dVar28 = dVar29 * 3.0 - dVar34;
    dVar29 = -dVar35;
    dVar23 = dVar23 * 3.0 - dVar35;
    dVar36 = 0.364705890417099 / dVar36;
    dVar37 = dVar36 * 2.0322580337524414;
    uVar15 = (uint)((dVar27 * dVar30 - dVar26 * dVar40) * dVar36 + 0.5);
    if (0x1e < (int)uVar15) {
      uVar15 = 0x1f;
    }
    local_58 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      local_58 = 0;
    }
    if (refinement_level == 0) {
      uVar16 = (uint)((dVar40 * dVar33 + dVar43 * dVar26) * dVar36 + 0.5);
      uVar15 = 0x1f;
      if ((int)uVar16 < 0x1f) {
        uVar15 = uVar16;
      }
      if ((int)uVar15 < 1) {
        uVar15 = 0;
      }
      auVar38._0_4_ = (int)local_58 << 0xb;
      auVar38._4_4_ = uVar15 << 0xb;
      auVar38._8_8_ = 0;
      uVar15 = (uint)(dVar37 * (dVar34 * dVar30 + -dVar28 * dVar26) + 0.5);
      uVar16 = (uint)(dVar37 * (dVar28 * dVar33 + dVar39 * dVar26) + 0.5);
      uVar41 = -(uint)((int)uVar15 < 0x3f);
      uVar42 = -(uint)((int)uVar16 < 0x3f);
      uVar15 = ~uVar41 & 0x3f | uVar15 & uVar41;
      uVar16 = ~uVar42 & 0x3f | uVar16 & uVar42;
      auVar32._0_4_ = (int)(dVar36 * (dVar35 * dVar30 + -dVar23 * dVar26) + 0.5);
      auVar32._4_4_ = (int)(dVar36 * (dVar23 * dVar33 + dVar29 * dVar26) + 0.5);
      auVar32._8_8_ = 0;
      auVar25._0_4_ = (-(uint)(0 < (int)uVar15) & uVar15) << 5;
      auVar25._4_4_ = (-(uint)(0 < (int)uVar16) & uVar16) << 5;
      auVar25._8_8_ = 0;
      auVar31._0_4_ = -(uint)(auVar32._0_4_ < (int)DAT_001b0440);
      auVar31._4_4_ = -(uint)(auVar32._4_4_ < DAT_001b0440._4_4_);
      auVar31._8_4_ = -(uint)(0 < DAT_001b0440._8_4_);
      auVar31._12_4_ = -(uint)(0 < DAT_001b0440._12_4_);
      auVar32 = ~auVar31 & _DAT_001b0440 | auVar32 & auVar31;
      auVar24._0_4_ = -(uint)(0 < auVar32._0_4_);
      auVar24._4_4_ = -(uint)(0 < auVar32._4_4_);
      auVar24._8_4_ = -(uint)(0 < auVar32._8_4_);
      auVar24._12_4_ = -(uint)(0 < auVar32._12_4_);
      auVar25 = auVar24 & auVar32 | auVar38 | auVar25;
      if (auVar25._4_4_ < auVar25._0_4_) {
        auVar32 = pshuflw(auVar25,auVar25,0xe8);
        local_88.m_u32 = auVar32._0_4_;
      }
      else {
        auVar32 = pshuflw(auVar25,auVar25,0xe2);
        local_88.m_u32 = auVar32._0_4_;
      }
      bVar17 = evaluate_solution(this,(dxt1_solution_coordinates *)&local_88.field_0,false);
    }
    else {
      dVar27 = (dVar34 * dVar30 - dVar26 * dVar28) * dVar37 + 0.5;
      local_50 = this;
      if (refinement_level == 1) {
        local_6c = (int)dVar27;
        if (0x3e < local_6c) {
          local_6c = 0x3f;
        }
        iVar21 = 0;
        if (local_6c < 1) {
          local_6c = iVar21;
        }
        local_70 = (int)((dVar35 * dVar30 - dVar26 * dVar23) * dVar36 + 0.5);
        if (0x1e < local_70) {
          local_70 = 0x1f;
        }
        if (local_70 < 1) {
          local_70 = iVar21;
        }
        iVar10 = (int)((dVar40 * dVar33 + dVar43 * dVar26) * dVar36 + 0.5);
        if (0x1e < iVar10) {
          iVar10 = 0x1f;
        }
        if (iVar10 < 1) {
          iVar10 = iVar21;
        }
        local_60 = CONCAT44(local_60._4_4_,iVar10);
        local_74 = (int)((dVar28 * dVar33 + dVar39 * dVar26) * dVar37 + 0.5);
        if (0x3e < local_74) {
          local_74 = 0x3f;
        }
        if (local_74 < 1) {
          local_74 = iVar21;
        }
        local_78 = (int)((dVar23 * dVar33 + dVar29 * dVar26) * dVar36 + 0.5);
        if (0x1e < local_78) {
          local_78 = 0x1f;
        }
        if (local_78 < 1) {
          local_78 = iVar21;
        }
        uVar14 = CONCAT71((uint7)(uint3)((uint)local_78 >> 8),1);
        bVar17 = false;
        do {
          local_7c = (uint)uVar14;
          local_68 = CONCAT44(local_68._4_4_,0xffffffff);
          do {
            iVar21 = -1;
            do {
              iVar10 = -1;
              do {
                local_88.field_0.g = (char)local_6c;
                local_88.field_0.r = (char)local_58;
                local_88.field_0.b = (char)local_70;
                uVar20 = '\0';
                local_88.field_0.a = 0;
                local_84.field_0.r = (uchar)local_60;
                local_84.field_0.g = (uchar)local_74;
                local_84.field_0.b = (uchar)local_78;
                local_84.field_0.a = '\0';
                iVar11 = (uint)(paVar22->field_0).r + (int)local_68;
                if (0x1e < iVar11) {
                  iVar11 = 0x1f;
                }
                uVar7 = (uchar)iVar11;
                if (iVar11 < 1) {
                  uVar7 = uVar20;
                }
                (paVar22->field_0).r = uVar7;
                iVar11 = (uint)paVar22->c[1] + iVar21;
                if (0x3e < iVar11) {
                  iVar11 = 0x3f;
                }
                uVar7 = (uchar)iVar11;
                if (iVar11 < 1) {
                  uVar7 = uVar20;
                }
                paVar22->c[1] = uVar7;
                iVar11 = (uint)paVar22->c[2] + iVar10;
                if (0x1e < iVar11) {
                  iVar11 = 0x1f;
                }
                uVar7 = (uchar)iVar11;
                if (iVar11 < 1) {
                  uVar7 = uVar20;
                }
                paVar22->c[2] = uVar7;
                uVar9 = dxt1_block::pack_color((color_quad_u8 *)&local_88.field_0,false,0x7f);
                local_80.m_low_color = uVar9;
                local_80.m_high_color =
                     dxt1_block::pack_color((color_quad_u8 *)&local_84.field_0,false,0x7f);
                if (uVar9 < local_80.m_high_color) {
                  local_80.m_low_color = local_80.m_high_color;
                  local_80.m_high_color = uVar9;
                }
                bVar8 = evaluate_solution(local_50,&local_80,false);
                bVar17 = (bool)(bVar17 | bVar8);
                iVar10 = iVar10 + 1;
              } while (iVar10 != 2);
              iVar21 = iVar21 + 1;
            } while (iVar21 != 2);
            iVar21 = (int)local_68 + 1;
            local_68 = CONCAT44(local_68._4_4_,iVar21);
          } while (iVar21 != 2);
          paVar22 = &local_84;
          uVar14 = 0;
        } while ((local_7c & 1) != 0);
      }
      else {
        uVar15 = (uint)dVar27;
        if (0x3e < (int)uVar15) {
          uVar15 = 0x3f;
        }
        local_40 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          local_40 = 0;
        }
        uVar15 = (uint)((dVar35 * dVar30 - dVar26 * dVar23) * dVar36 + 0.5);
        if (0x1e < (int)uVar15) {
          uVar15 = 0x1f;
        }
        local_60 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          local_60 = 0;
        }
        local_74 = (int)((dVar40 * dVar33 + dVar43 * dVar26) * dVar36 + 0.5);
        if (0x1e < local_74) {
          local_74 = 0x1f;
        }
        iVar21 = 0;
        if (local_74 < 1) {
          local_74 = iVar21;
        }
        local_78 = (int)((dVar28 * dVar33 + dVar39 * dVar26) * dVar37 + 0.5);
        if (0x3e < local_78) {
          local_78 = 0x3f;
        }
        if (local_78 < 1) {
          local_78 = iVar21;
        }
        local_7c = (uint)((dVar23 * dVar33 + dVar29 * dVar26) * dVar36 + 0.5);
        if (0x1e < (int)local_7c) {
          local_7c = 0x1f;
        }
        if ((int)local_7c < 1) {
          local_7c = iVar21;
        }
        local_48 = 0xffffffff;
        bVar17 = false;
        do {
          local_70 = (int)local_48 + (int)local_58;
          if (0x1e < local_70) {
            local_70 = 0x1f;
          }
          if (local_70 < 1) {
            local_70 = 0;
          }
          local_38 = 0xffffffff;
          do {
            local_6c = (int)local_38 + (int)local_40;
            if (0x3e < local_6c) {
              local_6c = 0x3f;
            }
            if (local_6c < 1) {
              local_6c = 0;
            }
            local_68 = 0xffffffff;
            do {
              local_84.field_0.r = (uchar)local_74;
              local_84.field_0.g = (uchar)local_78;
              local_84.field_0.b = (uchar)local_7c;
              local_84.field_0.a = '\0';
              local_88.field_0.g = (char)local_6c;
              local_88.field_0.r = (char)local_70;
              iVar21 = (int)local_60 + (int)local_68;
              if (0x1e < iVar21) {
                iVar21 = 0x1f;
              }
              local_88.field_0.b = (char)iVar21;
              if (iVar21 < 1) {
                local_88.field_0.b = 0;
              }
              local_88.field_0.a = 0;
              iVar21 = -1;
              do {
                iVar10 = -1;
                do {
                  iVar11 = -1;
                  do {
                    iVar12 = (uint)local_84.field_0.r + iVar21;
                    if (0x1e < iVar12) {
                      iVar12 = 0x1f;
                    }
                    local_84.field_0.r = (uchar)iVar12;
                    if (iVar12 < 1) {
                      local_84.field_0.r = 0;
                    }
                    iVar12 = (uint)local_84.field_0.g + iVar10;
                    if (0x3e < iVar12) {
                      iVar12 = 0x3f;
                    }
                    local_84.field_0.g = (uchar)iVar12;
                    if (iVar12 < 1) {
                      local_84.field_0.g = 0;
                    }
                    iVar12 = (uint)local_84.field_0.b + iVar11;
                    if (0x1e < iVar12) {
                      iVar12 = 0x1f;
                    }
                    local_84.field_0.b = (uchar)iVar12;
                    if (iVar12 < 1) {
                      local_84.field_0.b = 0;
                    }
                    uVar9 = dxt1_block::pack_color((color_quad_u8 *)&local_88.field_0,false,0x7f);
                    local_80.m_low_color = uVar9;
                    local_80.m_high_color =
                         dxt1_block::pack_color((color_quad_u8 *)&local_84.field_0,false,0x7f);
                    if (uVar9 < local_80.m_high_color) {
                      local_80.m_low_color = local_80.m_high_color;
                      local_80.m_high_color = uVar9;
                    }
                    bVar8 = evaluate_solution(local_50,&local_80,false);
                    bVar17 = (bool)(bVar17 | bVar8);
                    iVar11 = iVar11 + 1;
                  } while (iVar11 != 2);
                  iVar10 = iVar10 + 1;
                } while (iVar10 != 2);
                iVar21 = iVar21 + 1;
              } while (iVar21 != 2);
              uVar15 = (int)local_68 + 1;
              local_68 = (ulong)uVar15;
            } while (uVar15 != 2);
            uVar15 = (int)local_38 + 1;
            local_38 = (ulong)uVar15;
          } while (uVar15 != 2);
          uVar15 = (int)local_48 + 1;
          local_48 = (ulong)uVar15;
        } while (uVar15 != 2);
      }
    }
  }
  return bVar17;
}

Assistant:

bool dxt1_endpoint_optimizer::refine_solution(int refinement_level)
    {
        compute_selectors();

        static const int w1Tab[4] = { 3, 0, 2, 1 };

        static const int prods_0[4] = { 0x00, 0x00, 0x02, 0x02 };
        static const int prods_1[4] = { 0x00, 0x09, 0x01, 0x04 };
        static const int prods_2[4] = { 0x09, 0x00, 0x04, 0x01 };

        double akku_0 = 0;
        double akku_1 = 0;
        double akku_2 = 0;
        double At1_r, At1_g, At1_b;
        double At2_r, At2_g, At2_b;

        At1_r = At1_g = At1_b = 0;
        At2_r = At2_g = At2_b = 0;
        for (uint i = 0; i < m_unique_colors.size(); i++)
        {
            const color_quad_u8& c = m_unique_colors[i].m_color;
            const double weight = m_unique_colors[i].m_weight;

            double r = c.r * weight;
            double g = c.g * weight;
            double b = c.b * weight;
            int step = m_best_solution.m_selectors[i] ^ 1;

            int w1 = w1Tab[step];

            akku_0 += prods_0[step] * weight;
            akku_1 += prods_1[step] * weight;
            akku_2 += prods_2[step] * weight;
            At1_r += w1 * r;
            At1_g += w1 * g;
            At1_b += w1 * b;
            At2_r += r;
            At2_g += g;
            At2_b += b;
        }

        At2_r = 3 * At2_r - At1_r;
        At2_g = 3 * At2_g - At1_g;
        At2_b = 3 * At2_b - At1_b;

        double xx = akku_2;
        double yy = akku_1;
        double xy = akku_0;

        double t = xx * yy - xy * xy;
        if (!yy || !xx || (fabs(t) < .0000125f))
        {
            return false;
        }

        double frb = (3.0f * 31.0f / 255.0f) / t;
        double fg = frb * (63.0f / 31.0f);

        bool improved = false;

        if (refinement_level == 0)
        {
            uint max16;
            max16 = math::clamp<int>(static_cast<int>((At1_r * yy - At2_r * xy) * frb + 0.5f), 0, 31) << 11;
            max16 |= math::clamp<int>(static_cast<int>((At1_g * yy - At2_g * xy) * fg + 0.5f), 0, 63) << 5;
            max16 |= math::clamp<int>(static_cast<int>((At1_b * yy - At2_b * xy) * frb + 0.5f), 0, 31) << 0;

            uint min16;
            min16 = math::clamp<int>(static_cast<int>((At2_r * xx - At1_r * xy) * frb + 0.5f), 0, 31) << 11;
            min16 |= math::clamp<int>(static_cast<int>((At2_g * xx - At1_g * xy) * fg + 0.5f), 0, 63) << 5;
            min16 |= math::clamp<int>(static_cast<int>((At2_b * xx - At1_b * xy) * frb + 0.5f), 0, 31) << 0;

            dxt1_solution_coordinates nc((uint16)min16, (uint16)max16);
            nc.canonicalize();
            improved |= evaluate_solution(nc);
        }
        else if (refinement_level == 1)
        {
            // Try exploring the local lattice neighbors of the least squares optimized result.
            color_quad_u8 e[2];

            e[0].clear();
            e[0][0] = (uint8)math::clamp<int>(static_cast<int>((At1_r * yy - At2_r * xy) * frb + 0.5f), 0, 31);
            e[0][1] = (uint8)math::clamp<int>(static_cast<int>((At1_g * yy - At2_g * xy) * fg + 0.5f), 0, 63);
            e[0][2] = (uint8)math::clamp<int>(static_cast<int>((At1_b * yy - At2_b * xy) * frb + 0.5f), 0, 31);

            e[1].clear();
            e[1][0] = (uint8)math::clamp<int>(static_cast<int>((At2_r * xx - At1_r * xy) * frb + 0.5f), 0, 31);
            e[1][1] = (uint8)math::clamp<int>(static_cast<int>((At2_g * xx - At1_g * xy) * fg + 0.5f), 0, 63);
            e[1][2] = (uint8)math::clamp<int>(static_cast<int>((At2_b * xx - At1_b * xy) * frb + 0.5f), 0, 31);

            for (uint i = 0; i < 2; i++)
            {
                for (int rr = -1; rr <= 1; rr++)
                {
                    for (int gr = -1; gr <= 1; gr++)
                    {
                        for (int br = -1; br <= 1; br++)
                        {
                            dxt1_solution_coordinates nc;

                            color_quad_u8 c[2];
                            c[0] = e[0];
                            c[1] = e[1];

                            c[i][0] = (uint8)math::clamp<int>(c[i][0] + rr, 0, 31);
                            c[i][1] = (uint8)math::clamp<int>(c[i][1] + gr, 0, 63);
                            c[i][2] = (uint8)math::clamp<int>(c[i][2] + br, 0, 31);

                            nc.m_low_color = dxt1_block::pack_color(c[0], false);
                            nc.m_high_color = dxt1_block::pack_color(c[1], false);

                            nc.canonicalize();
                            improved |= evaluate_solution(nc);
                        }
                    }
                }
            }
        }
        else
        {
            // Try even harder to explore the local lattice neighbors of the least squares optimized result.
            color_quad_u8 e[2];
            e[0].clear();
            e[0][0] = (uint8)math::clamp<int>(static_cast<int>((At1_r * yy - At2_r * xy) * frb + 0.5f), 0, 31);
            e[0][1] = (uint8)math::clamp<int>(static_cast<int>((At1_g * yy - At2_g * xy) * fg + 0.5f), 0, 63);
            e[0][2] = (uint8)math::clamp<int>(static_cast<int>((At1_b * yy - At2_b * xy) * frb + 0.5f), 0, 31);

            e[1].clear();
            e[1][0] = (uint8)math::clamp<int>(static_cast<int>((At2_r * xx - At1_r * xy) * frb + 0.5f), 0, 31);
            e[1][1] = (uint8)math::clamp<int>(static_cast<int>((At2_g * xx - At1_g * xy) * fg + 0.5f), 0, 63);
            e[1][2] = (uint8)math::clamp<int>(static_cast<int>((At2_b * xx - At1_b * xy) * frb + 0.5f), 0, 31);

            for (int orr = -1; orr <= 1; orr++)
            {
                for (int ogr = -1; ogr <= 1; ogr++)
                {
                    for (int obr = -1; obr <= 1; obr++)
                    {
                        dxt1_solution_coordinates nc;

                        color_quad_u8 c[2];
                        c[0] = e[0];
                        c[1] = e[1];

                        c[0][0] = (uint8)math::clamp<int>(c[0][0] + orr, 0, 31);
                        c[0][1] = (uint8)math::clamp<int>(c[0][1] + ogr, 0, 63);
                        c[0][2] = (uint8)math::clamp<int>(c[0][2] + obr, 0, 31);

                        for (int rr = -1; rr <= 1; rr++)
                        {
                            for (int gr = -1; gr <= 1; gr++)
                            {
                                for (int br = -1; br <= 1; br++)
                                {
                                    c[1][0] = (uint8)math::clamp<int>(c[1][0] + rr, 0, 31);
                                    c[1][1] = (uint8)math::clamp<int>(c[1][1] + gr, 0, 63);
                                    c[1][2] = (uint8)math::clamp<int>(c[1][2] + br, 0, 31);

                                    nc.m_low_color = dxt1_block::pack_color(c[0], false);
                                    nc.m_high_color = dxt1_block::pack_color(c[1], false);
                                    nc.canonicalize();

                                    improved |= evaluate_solution(nc);
                                }
                            }
                        }
                    }
                }
            }
        }

        return improved;
    }